

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  bool bVar1;
  ulong uVar2;
  XmlWriter *this_00;
  string *text;
  string *in_RCX;
  string *in_RDX;
  JunitReporter *in_RSI;
  long in_RDI;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  ChildSections *__range1;
  ScopedElement e;
  string name;
  JunitReporter *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *in_stack_fffffffffffffcf0;
  allocator *this_01;
  SectionNode *in_stack_fffffffffffffcf8;
  JunitReporter *in_stack_fffffffffffffd00;
  XmlWriter *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  XmlWriter *in_stack_fffffffffffffd40;
  undefined1 local_289 [33];
  reference local_268;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *local_260;
  __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  local_258;
  size_type *local_250;
  string local_248 [39];
  allocator local_221;
  string local_220 [40];
  string local_1f8 [39];
  undefined1 local_1d1 [41];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  undefined1 local_131 [40];
  undefined1 local_109 [41];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [56];
  string local_80 [32];
  string local_60 [32];
  string local_40 [24];
  SectionNode *in_stack_ffffffffffffffd8;
  JunitReporter *this_02;
  
  trim((string *)in_stack_fffffffffffffcf8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcf8,(char)((ulong)in_stack_fffffffffffffcf0 >> 0x38));
    std::operator+(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
  }
  bVar1 = clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::empty
                    (in_stack_fffffffffffffcf0);
  if (((!bVar1) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) ||
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"testcase",&local_b9);
    XmlWriter::scopedElement(in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffd30 = (string *)local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_131 + 1),"classname",(allocator *)in_stack_fffffffffffffd30);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::__cxx11::string::~string((string *)(local_131 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"name",&local_159);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"classname",(allocator *)(local_109 + 0x28));
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)(local_109 + 0x28));
      in_stack_fffffffffffffd38 = (string *)(in_RDI + 0xd8);
      in_stack_fffffffffffffd40 = (XmlWriter *)local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_109 + 1),"name",(allocator *)in_stack_fffffffffffffd40);
      XmlWriter::writeAttribute<char[5]>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (char (*) [5])in_stack_fffffffffffffd30);
      std::__cxx11::string::~string((string *)(local_109 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_109);
    }
    this_00 = (XmlWriter *)(in_RDI + 0xd8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"time",&local_181);
    Detail::stringify<double>((double *)in_stack_fffffffffffffcd8);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    writeAssertions(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffcf8 = (SectionNode *)(in_RDI + 0xd8);
      in_stack_fffffffffffffd00 = (JunitReporter *)local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1d1 + 1),"system-out",(allocator *)in_stack_fffffffffffffd00);
      XmlWriter::scopedElement(this_00,(string *)in_stack_fffffffffffffd00);
      trim((string *)in_stack_fffffffffffffcf8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                 SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
      std::__cxx11::string::~string(local_1f8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string((string *)(local_1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      text = (string *)(in_RDI + 0xd8);
      this_01 = &local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"system-err",this_01);
      XmlWriter::scopedElement(this_00,(string *)in_stack_fffffffffffffd00);
      trim((string *)in_stack_fffffffffffffcf8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)this_01,text,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
      std::__cxx11::string::~string(local_248);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffce0);
  }
  local_250 = &in_RCX[4]._M_string_length;
  local_258._M_current =
       (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
       clara::std::
       vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
       ::begin((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                *)in_stack_fffffffffffffcd8);
  local_260 = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              clara::std::
              vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
              ::end((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                     *)in_stack_fffffffffffffcd8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffcd8), bVar1) {
    local_268 = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ::operator*(&local_258);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_02 = in_RSI;
      clara::std::
      __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffce0);
      writeSection(this_02,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      in_stack_fffffffffffffcd8 = in_RSI;
      in_RSI = this_02;
    }
    else {
      in_stack_fffffffffffffce0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_289 + 1),"",(allocator *)in_stack_fffffffffffffce0);
      clara::std::
      __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffce0);
      writeSection(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      std::__cxx11::string::~string((string *)(local_289 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_289);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
    ::operator++(&local_258);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JunitReporter::writeSection(  std::string const& className,
                        std::string const& rootName,
                        SectionNode const& sectionNode ) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( !sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname", name );
                xml.writeAttribute( "name", "root" );
            }
            else {
                xml.writeAttribute( "classname", className );
                xml.writeAttribute( "name", name );
            }
            xml.writeAttribute( "time", ::Catch::Detail::stringify( sectionNode.stats.durationInSeconds ) );

            writeAssertions( sectionNode );

            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), false );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), false );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode );
            else
                writeSection( className, name, *childNode );
    }